

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_out_scope.cpp
# Opt level: O2

void __thiscall A::A(A *this,A *other)

{
  float *pfVar1;
  int i;
  int iVar2;
  float *pfVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  
  this->n_ = other->n_;
  lVar5 = (long)other->n_ * (long)other->n_;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)lVar5) {
    uVar6 = lVar5 * 4;
  }
  pfVar3 = (float *)operator_new__(uVar6);
  this->c = pfVar3;
  this->name_ = other->name_;
  spin_mutex_t::lock(&my_io_mutex);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Copying ");
  poVar4 = std::operator<<(poVar4,this->name_);
  std::endl<char,std::char_traits<char>>(poVar4);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  for (iVar2 = 0; iVar2 < this->n_; iVar2 = iVar2 + 1) {
    pfVar3 = other->c;
    pfVar1 = this->c;
    for (lVar5 = 0; (int)lVar5 < this->n_; lVar5 = lVar5 + 1) {
      pfVar1[(long)this->n_ * (long)iVar2 + lVar5] = pfVar3[(long)this->n_ * (long)iVar2 + lVar5];
    }
  }
  return;
}

Assistant:

A(const A& other) 
  : n_(other.n_), c(new float[other.n_ * other.n_]), name_(other.name_)
  {
    LOG("Copying " << name_);
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
	c[i*n_+j] = other.c[i*n_+j];
      }
  }